

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O2

void __thiscall
merkle_tests::merkle_test_LeftSubtreeRightSubtree::test_method
          (merkle_test_LeftSubtreeRightSubtree *this)

{
  long lVar1;
  vector<uint256,_std::allocator<uint256>_> hashes;
  ulong uVar2;
  iterator in_R8;
  iterator in_R9;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  undefined8 in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  pointer in_stack_fffffffffffffd68;
  undefined **local_290;
  undefined1 local_288;
  undefined1 *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  _Vector_base<uint256,_std::allocator<uint256>_> local_250;
  vector<uint256,_std::allocator<uint256>_> leftRight;
  uint256 rootOfLR;
  uint256 rootOfRightSubtree;
  uint256 rootOfLeftSubtree;
  uint256 root;
  CBlock rightSubtreeBlock;
  CBlock leftSubtreeBlock;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(&block);
  CBlock::CBlock(&leftSubtreeBlock);
  CBlock::CBlock(&rightSubtreeBlock);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize(&block.vtx,4);
  lVar4 = 0;
  uVar2 = 0;
  while( true ) {
    if ((ulong)((long)block.vtx.
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)block.vtx.
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar2) break;
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)&root);
    std::make_shared<CTransaction_const,CMutableTransaction>
              ((CMutableTransaction *)&rootOfLeftSubtree);
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&((block.vtx.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               lVar4),(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                      &rootOfLeftSubtree);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (rootOfLeftSubtree.super_base_blob<256U>.m_data._M_elems + 8));
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&root);
    uVar2 = uVar2 + 1;
    lVar4 = lVar4 + 0x10;
  }
  lVar4 = 0;
  uVar2 = 0;
  while( true ) {
    uVar3 = (long)block.vtx.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)block.vtx.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    uVar5 = uVar3 >> 1;
    if (uVar5 <= uVar2) break;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::push_back(&leftSubtreeBlock.vtx,
                (value_type *)
                ((long)&((block.vtx.
                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                lVar4));
    uVar2 = uVar2 + 1;
    lVar4 = lVar4 + 0x10;
  }
  lVar4 = (uVar3 & 0x1ffffffffffffffe) << 3;
  for (; uVar5 < (ulong)((long)block.vtx.
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)block.vtx.
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4); uVar5 = uVar5 + 1) {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::push_back(&rightSubtreeBlock.vtx,
                (value_type *)
                ((long)&((block.vtx.
                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                lVar4));
    lVar4 = lVar4 + 0x10;
  }
  BlockMerkleRoot(&root,&block,(bool *)0x0);
  BlockMerkleRoot(&rootOfLeftSubtree,&leftSubtreeBlock,(bool *)0x0);
  BlockMerkleRoot(&rootOfRightSubtree,&rightSubtreeBlock,(bool *)0x0);
  leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<uint256,_std::allocator<uint256>_>::push_back(&leftRight,&rootOfLeftSubtree);
  std::vector<uint256,_std::allocator<uint256>_>::push_back(&leftRight,&rootOfRightSubtree);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)&local_250,&leftRight);
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffd60;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_fffffffffffffd58;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffffd68;
  ComputeMerkleRoot(&rootOfLR,hashes,(bool *)&local_250);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base(&local_250);
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/merkle_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x147;
  file.m_begin = (iterator)&local_260;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_270,msg);
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_01139f30;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_290,&stack0xfffffffffffffd60,0x147,1,2,&root,"root",&rootOfLR,"rootOfLR");
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&rightSubtreeBlock.vtx);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&leftSubtreeBlock.vtx);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_test_LeftSubtreeRightSubtree)
{
    CBlock block, leftSubtreeBlock, rightSubtreeBlock;

    block.vtx.resize(4);
    std::size_t pos;
    for (pos = 0; pos < block.vtx.size(); pos++) {
        CMutableTransaction mtx;
        mtx.nLockTime = pos;
        block.vtx[pos] = MakeTransactionRef(std::move(mtx));
    }

    for (pos = 0; pos < block.vtx.size() / 2; pos++)
        leftSubtreeBlock.vtx.push_back(block.vtx[pos]);

    for (pos = block.vtx.size() / 2; pos < block.vtx.size(); pos++)
        rightSubtreeBlock.vtx.push_back(block.vtx[pos]);

    uint256 root = BlockMerkleRoot(block);
    uint256 rootOfLeftSubtree = BlockMerkleRoot(leftSubtreeBlock);
    uint256 rootOfRightSubtree = BlockMerkleRoot(rightSubtreeBlock);
    std::vector<uint256> leftRight;
    leftRight.push_back(rootOfLeftSubtree);
    leftRight.push_back(rootOfRightSubtree);
    uint256 rootOfLR = ComputeMerkleRoot(leftRight);

    BOOST_CHECK_EQUAL(root, rootOfLR);
}